

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O3

int __thiscall
icu_63::PluralFormat::clone
          (PluralFormat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PluralFormat *this_00;
  
  this_00 = (PluralFormat *)UMemory::operator_new((UMemory *)0x2c8,(size_t)__fn);
  if (this_00 != (PluralFormat *)0x0) {
    PluralFormat(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Format*
PluralFormat::clone() const
{
    return new PluralFormat(*this);
}